

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O0

Array<asl::Map<asl::String,_asl::Dic<asl::String>_>::KeyVal> * __thiscall
asl::Array<asl::Map<asl::String,_asl::Dic<asl::String>_>::KeyVal>::reserve
          (Array<asl::Map<asl::String,_asl::Dic<asl::String>_>::KeyVal> *this,int m)

{
  int iVar1;
  int iVar2;
  Data *pDVar3;
  bad_alloc *pbVar4;
  KeyVal *__src;
  int local_7c;
  AtomicCount local_6c;
  void *local_68;
  char *p_2;
  int rc_1;
  char *p_1;
  int rc;
  int k;
  int j;
  int i;
  char *p;
  KeyVal *pKStack_30;
  int n;
  KeyVal *b;
  int local_20;
  int s1;
  int s;
  int m_local;
  Array<asl::Map<asl::String,_asl::Dic<asl::String>_>::KeyVal> *this_local;
  
  s1 = m;
  _s = this;
  pDVar3 = d(this);
  local_7c = pDVar3->s;
  if (local_7c < s1) {
    local_20 = local_7c;
    if (local_7c < s1) {
      m = s1;
      local_7c = max<int>((local_7c << 3) / 4,s1);
    }
    b._4_4_ = local_7c;
    pKStack_30 = this->_a;
    pDVar3 = d(this);
    p._4_4_ = pDVar3->n;
    if ((b._4_4_ == local_20) || (0x7ff < (ulong)((long)local_20 << 5))) {
      if (b._4_4_ != local_20) {
        dup(this,m);
        pDVar3 = d(this);
        p_1._0_4_ = AtomicCount::operator_cast_to_int(&pDVar3->rc);
        _rc_1 = realloc((void *)((long)&this->_a[-1].key.field_2 + 8),(long)b._4_4_ * 0x20 + 0x10);
        if (_rc_1 == (void *)0x0) {
          pbVar4 = (bad_alloc *)__cxa_allocate_exception(8);
          std::bad_alloc::bad_alloc(pbVar4);
          __cxa_throw(pbVar4,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
        }
        pKStack_30 = (KeyVal *)((long)_rc_1 + 0x10);
        this->_a = pKStack_30;
        m = (int)p_1;
        AtomicCount::AtomicCount((AtomicCount *)((long)&p_2 + 4),(int)p_1);
        pDVar3 = d(this);
        iVar2 = b._4_4_;
        (pDVar3->rc).n = p_2._4_4_;
        pDVar3 = d(this);
        iVar1 = p._4_4_;
        pDVar3->s = iVar2;
        pDVar3 = d(this);
        pDVar3->n = iVar1;
        b._4_4_ = local_20;
      }
    }
    else {
      _j = malloc((long)b._4_4_ * 0x20 + 0x10);
      if (_j == (void *)0x0) {
        pbVar4 = (bad_alloc *)__cxa_allocate_exception(8);
        std::bad_alloc::bad_alloc(pbVar4);
        __cxa_throw(pbVar4,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
      pKStack_30 = (KeyVal *)((long)_j + 0x10);
      k = min<int>(s1,p._4_4_);
      rc = 0x20;
      p_1._4_4_ = k * 0x20;
      __src = this->_a;
      memcpy(pKStack_30,__src,(long)p_1._4_4_);
      m = (int)__src;
    }
    if (b._4_4_ != local_20) {
      dup(this,m);
      pDVar3 = d(this);
      p_2._0_4_ = AtomicCount::operator_cast_to_int(&pDVar3->rc);
      local_68 = (void *)((long)&this->_a[-1].key.field_2 + 8);
      ::free(local_68);
      this->_a = pKStack_30;
      AtomicCount::AtomicCount(&local_6c,(int)p_2);
      pDVar3 = d(this);
      iVar2 = b._4_4_;
      (pDVar3->rc).n = local_6c.n;
      pDVar3 = d(this);
      iVar1 = p._4_4_;
      pDVar3->s = iVar2;
      pDVar3 = d(this);
      pDVar3->n = iVar1;
    }
  }
  return this;
}

Assistant:

Array<T>& Array<T>::reserve(int m)
{
	int s=d().s;
	if (m <= s)
		return *this;
	int s1 = (m > s)? max(8*s/4, m) : s;
	T* b = _a;
	int n=d().n;
	if(s1 != s && s*sizeof(T) < 2048)
	{
		char* p = (char*) malloc( s1*sizeof(T)+sizeof(Data) );
		if(!p)
			ASL_BAD_ALLOC();
		b = (T*) ( p + sizeof(Data) );
		int i = min(m,n), j = sizeof(T), k = i*j;
		memcpy((char*)b, _a, k);
	}
	else if(s1 != s)
	{
		dup();
		int   rc = d().rc;
		ASL_RC_FREE();
		char* p = (char*) realloc( (char*)_a-sizeof(Data), s1*sizeof(T)+sizeof(Data) );
		if(!p)
			ASL_BAD_ALLOC();
		b = (T*) ( p + sizeof(Data) );
		_a = b;
		ASL_RC_INIT();
		d().rc = rc;
		d().s = s1;
		d().n = n;
		s1 = s;
	}
	if(s1 != s)
	{
		dup();
		int rc = d().rc;
		ASL_RC_FREE();
		char* p = (char*)_a - sizeof(Data);
		::free(p);
		_a = b;
		ASL_RC_INIT();
		d().rc = rc;
		d().s = s1;
		d().n = n;
	}
	return *this;
}